

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmtz.cpp
# Opt level: O1

ZoneHashEntry * __thiscall
AbbrHashEntry::search(AbbrHashEntry *this,int start_idx,ZoneSearchSpec *spec)

{
  int iVar1;
  int iVar2;
  int i;
  char *pcVar3;
  
  iVar1 = *(int *)&(this->super_CVmHashEntryCI).super_CVmHashEntry.field_0x24;
  iVar2 = iVar1 - start_idx;
  if (iVar2 == 0 || iVar1 < start_idx) {
    return (ZoneHashEntry *)0x0;
  }
  pcVar3 = &this->entries[start_idx].dst;
  while ((*(int *)(pcVar3 + -4) != spec->gmtofs || (*pcVar3 != spec->dst))) {
    pcVar3 = pcVar3 + 0x10;
    iVar2 = iVar2 + -1;
    if (iVar2 == 0) {
      return (ZoneHashEntry *)0x0;
    }
  }
  return ((AbbrToZone *)(pcVar3 + -0xc))->zone;
}

Assistant:

ZoneHashEntry *search(int start_idx, const ZoneSearchSpec *spec)
    {
        for (int i = start_idx ; i < entry_cnt ; ++i)
        {
            if (entries[i].gmtofs == spec->gmtofs
                && entries[i].dst == spec->dst)
                return entries[i].zone;
        }

        return 0;
    }